

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandUnfold(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Aig_Man_t *pAVar3;
  Gia_Man_t *p;
  Gia_Man_t *p_00;
  Abc_Ntk_t *pNtk_00;
  char *pcVar4;
  Gia_Man_t *pGia;
  Aig_Man_t *pAig;
  Gia_Man_t *pNew;
  uint local_50;
  int c;
  int fVerbose;
  int fOldAlgo;
  int fStruct;
  int nProps;
  int nConfs;
  int nFrames;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  nProps = 1;
  fStruct = 1000;
  fOldAlgo = 1000;
  fVerbose = 0;
  c = 0;
  local_50 = 0;
  Extra_UtilGetoptReset();
LAB_002987b4:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"FCPsavh");
    if (iVar1 == -1) {
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsComb(pAVar2);
      if ((iVar1 != 0) && (iVar1 = Abc_NtkPoNum(pAVar2), 1 < iVar1)) {
        Abc_Print(-1,"Combinational miter has more than one PO.\n");
        return 0;
      }
      iVar1 = Abc_NtkIsComb(pAVar2);
      if (iVar1 != 0) {
        pAVar3 = Abc_NtkToDar(pAVar2,0,0);
        p = Gia_ManFromAigSimple(pAVar3);
        Aig_ManStop(pAVar3);
        p_00 = Gia_ManDupWithConstr(p);
        Gia_ManStop(p);
        if (p_00 == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Cannot extract constrains from the miter.\n");
          return 0;
        }
        pAVar3 = Gia_ManToAigSimple(p_00);
        Gia_ManStop(p_00);
        pNtk_00 = Abc_NtkFromAigPhase(pAVar3);
        Aig_ManStop(pAVar3);
        if (pNtk_00->pName != (char *)0x0) {
          free(pNtk_00->pName);
          pNtk_00->pName = (char *)0x0;
        }
        pcVar4 = Extra_UtilStrsav(pAVar2->pName);
        pNtk_00->pName = pcVar4;
        Abc_FrameReplaceCurrentNetwork(pAbc,pNtk_00);
        return 0;
      }
      iVar1 = Abc_NtkIsStrash(pAVar2);
      if (iVar1 == 0) {
        Abc_Print(-1,"Currently only works for structurally hashed circuits.\n");
        return 0;
      }
      iVar1 = Abc_NtkConstrNum(pAVar2);
      if (0 < iVar1) {
        Abc_Print(-1,"Constraints are already extracted.\n");
        return 0;
      }
      iVar1 = Abc_NtkPoNum(pAVar2);
      if ((1 < iVar1) && (fVerbose == 0)) {
        Abc_Print(-1,
                  "Functional constraint extraction works for single-output miters (use \"orpos\").\n"
                 );
        return 0;
      }
      pAVar2 = Abc_NtkDarUnfold(pAVar2,nProps,fStruct,fOldAlgo,fVerbose,c,local_50);
      if (pAVar2 == (Abc_Ntk_t *)0x0) {
        Abc_Print(1,"Transformation has failed.\n");
        return 0;
      }
      Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
      return 0;
    }
    switch(iVar1) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_00298ba3;
      }
      fStruct = atoi(argv[globalUtilOptind]);
      iVar1 = fStruct;
      break;
    default:
      goto LAB_00298ba3;
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_00298ba3;
      }
      nProps = atoi(argv[globalUtilOptind]);
      iVar1 = nProps;
      break;
    case 0x50:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
        goto LAB_00298ba3;
      }
      fOldAlgo = atoi(argv[globalUtilOptind]);
      iVar1 = fOldAlgo;
      break;
    case 0x61:
      c = c ^ 1;
      goto LAB_002987b4;
    case 0x68:
      goto LAB_00298ba3;
    case 0x73:
      fVerbose = fVerbose ^ 1;
      goto LAB_002987b4;
    case 0x76:
      local_50 = local_50 ^ 1;
      goto LAB_002987b4;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_00298ba3:
      Abc_Print(-2,"usage: unfold [-FCP num] [-savh]\n");
      Abc_Print(-2,"\t         unfold hidden constraints as separate outputs\n");
      Abc_Print(-2,"\t-F num : the max number of timeframes to consider [default = %d]\n",
                (ulong)(uint)nProps);
      Abc_Print(-2,"\t-C num : the max number of conflicts in SAT solving [default = %d]\n",
                (ulong)(uint)fStruct);
      Abc_Print(-2,"\t-P num : the max number of constraint propagations [default = %d]\n",
                (ulong)(uint)fOldAlgo);
      pcVar4 = "no";
      if (fVerbose != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-s     : toggle detecting structural constraints [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (c == 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-a     : toggle fast implication detection [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (local_50 != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandUnfold( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int nFrames;
    int nConfs;
    int nProps;
    int fStruct;
    int fOldAlgo;
    int fVerbose;
    int c;
    extern Abc_Ntk_t * Abc_NtkDarUnfold( Abc_Ntk_t * pNtk, int nFrames, int nConfs, int nProps, int fStruct, int fOldAlgo, int fVerbose );
    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    nFrames   =      1;
    nConfs    =   1000;
    nProps    =   1000;
    fStruct   =      0;
    fOldAlgo  =      0;
    fVerbose  =      0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FCPsavh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfs < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nProps = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nProps < 0 )
                goto usage;
            break;
        case 's':
            fStruct ^= 1;
            break;
        case 'a':
            fOldAlgo ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkIsComb(pNtk) && Abc_NtkPoNum(pNtk) > 1 )
    {
        Abc_Print( -1, "Combinational miter has more than one PO.\n" );
        return 0;
    }
    if ( Abc_NtkIsComb(pNtk) )
    {
        extern Gia_Man_t * Gia_ManDupWithConstr( Gia_Man_t * p );
        Gia_Man_t * pNew;
        Aig_Man_t * pAig = Abc_NtkToDar( pNtk, 0, 0 );
        Gia_Man_t * pGia = Gia_ManFromAigSimple( pAig );
        Aig_ManStop( pAig );
        pNew = Gia_ManDupWithConstr( pGia );
        Gia_ManStop( pGia );
        if ( pNew == NULL )
        {
            Abc_Print( -1, "Cannot extract constrains from the miter.\n" );
            return 0;
        }
        pAig = Gia_ManToAigSimple( pNew );
        Gia_ManStop( pNew );
        pNtkRes = Abc_NtkFromAigPhase( pAig );
        Aig_ManStop( pAig );
        ABC_FREE( pNtkRes->pName );
        pNtkRes->pName = Extra_UtilStrsav( pNtk->pName );
        // replace the current network
        Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
        return 0;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Currently only works for structurally hashed circuits.\n" );
        return 0;
    }
    if ( Abc_NtkConstrNum(pNtk) > 0 )
    {
        Abc_Print( -1, "Constraints are already extracted.\n" );
        return 0;
    }
    if ( Abc_NtkPoNum(pNtk) > 1 && !fStruct )
    {
        Abc_Print( -1, "Functional constraint extraction works for single-output miters (use \"orpos\").\n" );
        return 0;
    }
    // modify the current network
    pNtkRes = Abc_NtkDarUnfold( pNtk, nFrames, nConfs, nProps, fStruct, fOldAlgo, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( 1,"Transformation has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;
usage:
    Abc_Print( -2, "usage: unfold [-FCP num] [-savh]\n" );
    Abc_Print( -2, "\t         unfold hidden constraints as separate outputs\n" );
    Abc_Print( -2, "\t-F num : the max number of timeframes to consider [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-C num : the max number of conflicts in SAT solving [default = %d]\n", nConfs );
    Abc_Print( -2, "\t-P num : the max number of constraint propagations [default = %d]\n", nProps );
    Abc_Print( -2, "\t-s     : toggle detecting structural constraints [default = %s]\n", fStruct? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle fast implication detection [default = %s]\n", !fOldAlgo? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}